

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallTargetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  char *pcVar1;
  allocator local_71;
  undefined1 local_70 [16];
  PositionType local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  cmGeneratorExpression ge;
  
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)(local_70 + 8));
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)(local_70 + 8));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_70 + 8));
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(string *)&ge);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_70._8_8_ = &local_58;
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_70._0_8_,lg,config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)(local_70 + 8));
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_71);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->Target->GetLocalGenerator(), config);
}